

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

int __thiscall StatisticsApp::run(StatisticsApp *this)

{
  ulong uVar1;
  byte bVar2;
  pointer pcVar3;
  ulong *puVar4;
  ostream *stream;
  double dVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  ostream *extraout_RAX;
  ostream *extraout_RAX_00;
  ostream *extraout_RAX_01;
  ostream *extraout_RAX_02;
  long *plVar10;
  ostream *extraout_RAX_03;
  ostream *extraout_RAX_04;
  ostream *extraout_RAX_05;
  ulong *puVar11;
  ostream *extraout_RAX_06;
  ostream *extraout_RAX_07;
  ostream *extraout_RAX_08;
  ostream *extraout_RAX_09;
  ostream *extraout_RAX_10;
  pointer pDVar12;
  ostream *extraout_RAX_11;
  ostream *extraout_RAX_12;
  ostream *extraout_RAX_13;
  ostream *extraout_RAX_14;
  long lVar13;
  ostream *extraout_RAX_15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  istream *extraout_RDX;
  istream *extraout_RDX_00;
  istream *extraout_RDX_01;
  istream *extraout_RDX_02;
  istream *extraout_RDX_03;
  istream *extraout_RDX_04;
  istream *extraout_RDX_05;
  istream *extraout_RDX_06;
  istream *extraout_RDX_07;
  istream *extraout_RDX_08;
  istream *extraout_RDX_09;
  istream *piVar15;
  istream *extraout_RDX_10;
  istream *extraout_RDX_11;
  istream *extraout_RDX_12;
  istream *extraout_RDX_13;
  istream *extraout_RDX_14;
  istream *extraout_RDX_15;
  istream *extraout_RDX_16;
  istream *extraout_RDX_17;
  istream *extraout_RDX_18;
  istream *extraout_RDX_19;
  istream *extraout_RDX_20;
  istream *extraout_RDX_21;
  long lVar16;
  long lVar17;
  int iVar18;
  char *pcVar19;
  uint uVar20;
  undefined8 *puVar21;
  StatisticsApp *this_00;
  size_type sVar22;
  ulong uVar23;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double d;
  string line;
  DataVector data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  titles;
  StringSplitter parser;
  StatisticsWriter writer;
  stringstream msg;
  DataVector dataMasked;
  string lineToReshape;
  RowSampler sampler;
  ifstream fileInput;
  undefined1 local_598 [32];
  StatisticsApp *local_578;
  uint local_570;
  int local_56c;
  string local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  int local_53c;
  vector<DataPoint,_std::allocator<DataPoint>_> local_538;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_518;
  StringSplitter local_4f8;
  vector<bool,_std::allocator<bool>_> *local_4e0;
  StatisticsWriter local_4d8;
  undefined1 local_4b8 [8];
  pointer pbStack_4b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Bit_pointer local_498;
  uint auStack_490 [22];
  ios_base local_438 [272];
  vector<DataPoint,_std::allocator<DataPoint>_> local_328;
  DataFilters *local_308;
  string *local_300;
  long *local_2f8;
  ulong local_2f0;
  long local_2e8 [2];
  string local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  ulong local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a8;
  MultivariateTracker *local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_298;
  long *local_290;
  long local_288;
  long local_280 [2];
  RowSampler local_26c;
  long *local_258 [2];
  long local_248 [2];
  long local_238;
  
  this_00 = (StatisticsApp *)&stack0xfffffffffffffdc8;
  std::ifstream::ifstream((ifstream *)this_00,(this->_options).fileInput._M_dataplus._M_p,_S_in);
  iVar8 = *(int *)(&stack0xfffffffffffffde8 + *(long *)(local_238 + -0x18));
  if (iVar8 != 0) {
    this_00 = (StatisticsApp *)&std::cin;
  }
  if (2 < (int)Logger::logLevel) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_4a8._M_local_buf,
                        ApplicationProperties::NAME_abi_cxx11_._M_dataplus._M_p,
                        ApplicationProperties::NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," is starting",0xc);
    cVar6 = std::ios::widen((ios *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18)),'\n');
    poVar9 = (ostream *)std::ostream::put(poVar9,cVar6);
    dVar5 = (double)std::ostream::flush(poVar9);
    Logger::log(dVar5);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (extraout_RAX,local_4d8._comment._M_dataplus._M_p,local_4d8._comment._M_string_length)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._comment._M_dataplus._M_p != &local_4d8._comment.field_2) {
      operator_delete(local_4d8._comment._M_dataplus._M_p,
                      local_4d8._comment.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
    std::ios_base::~ios_base(local_438);
  }
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"#","");
  local_4d8._comment._M_dataplus._M_p = (pointer)&local_4d8._comment.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4d8,local_290,local_288 + (long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  local_26c._count = 0;
  local_26c._next = 1;
  local_26c._mode = (this->_options).sampling.mode;
  local_26c._sampled = 0;
  local_26c._step = (this->_options).sampling.step;
  uVar20 = 0;
  local_518.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_518.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_518.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8._tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f8._tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8._tokens.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
  local_538.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_538.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_538.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (iVar8 == 0) {
    puVar21 = &stack0xfffffffffffffdc8;
  }
  else {
    puVar21 = &std::cin;
  }
  local_578 = (StatisticsApp *)local_438;
  local_300 = &(this->_options).delimiter;
  local_4e0 = &(this->_options).filterColumns;
  local_308 = &(this->_options).filterRows;
  local_2a0 = &this->_tracker;
  local_2a8 = &local_568.field_2;
  local_570 = 0;
  local_56c = 0;
  local_53c = 0;
  piVar15 = extraout_RDX;
  do {
    readline_abi_cxx11_(&local_568,this_00,piVar15);
    piVar15 = extraout_RDX_00;
    if (*(int *)((long)puVar21 + *(long *)(*(long *)&this_00->_options + -0x18) + 0x20) == 0) {
      if (local_568._M_string_length == 0) {
        if ((this->_options).blankEOF == true) {
          bVar7 = true;
          if (4 < (int)Logger::logLevel) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_4a8._M_local_buf,"Blank line found. Exiting.",0x1a);
            cVar6 = std::ios::widen((ios *)((long)&local_4a8 +
                                           *(size_type *)(local_4a8._M_allocated_capacity - 0x18)),
                                    '\n');
            poVar9 = (ostream *)std::ostream::put((ostream *)local_4a8._M_local_buf,cVar6);
            dVar5 = (double)std::ostream::flush(poVar9);
            Logger::log(dVar5);
            std::__cxx11::stringbuf::str();
            std::__ostream_insert<char,std::char_traits<char>>
                      (extraout_RAX_01,(char *)local_598._0_8_,local_598._8_8_);
            goto LAB_00188abb;
          }
          goto LAB_0018904e;
        }
        if (4 < (int)Logger::logLevel) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4a8._M_local_buf,"Blank line found. Skipping.",0x1b);
          cVar6 = std::ios::widen((ios *)((long)&local_4a8 +
                                         *(size_type *)(local_4a8._M_allocated_capacity - 0x18)),
                                  '\n');
          poVar9 = (ostream *)std::ostream::put((ostream *)local_4a8._M_local_buf,cVar6);
          dVar5 = (double)std::ostream::flush(poVar9);
          Logger::log(dVar5);
          std::__cxx11::stringbuf::str();
          std::__ostream_insert<char,std::char_traits<char>>
                    (extraout_RAX_02,(char *)local_598._0_8_,local_598._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_598 + 0x10)) {
            operator_delete((void *)local_598._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p + 1));
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
          std::ios_base::~ios_base((ios_base *)local_578);
          piVar15 = extraout_RDX_03;
        }
      }
      else {
        iVar8 = std::__cxx11::string::compare
                          ((string *)&local_568,0,1,(this->_options).comment._M_dataplus._M_p);
        piVar15 = extraout_RDX_02;
        if (iVar8 != 0) {
          local_598._0_8_ = local_598 + 0x10;
          if (uVar20 == 0) {
            std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"");
          }
          else {
            pcVar3 = (this->_options).delimiter._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_598,pcVar3,
                       pcVar3 + (this->_options).delimiter._M_string_length);
          }
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((string *)local_598,local_568._M_dataplus._M_p,
                                       local_568._M_string_length);
          local_4b8 = (undefined1  [8])&local_4a8;
          paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 == paVar14) {
            local_4a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_4a8._8_8_ = plVar10[3];
          }
          else {
            local_4a8._M_allocated_capacity = paVar14->_M_allocated_capacity;
            local_4b8 = (undefined1  [8])*plVar10;
          }
          pbStack_4b0 = (pointer)plVar10[1];
          *plVar10 = (long)paVar14;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::_M_append((string *)&local_2f8,(char *)local_4b8,(ulong)pbStack_4b0)
          ;
          piVar15 = extraout_RDX_04;
          if (local_4b8 != (undefined1  [8])&local_4a8) {
            operator_delete((void *)local_4b8,(ulong)(local_4a8._M_allocated_capacity + 1));
            piVar15 = extraout_RDX_05;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_598._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_598 + 0x10)) {
            operator_delete((void *)local_598._0_8_,
                            (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p + 1));
            piVar15 = extraout_RDX_06;
          }
          uVar20 = uVar20 + 1;
          if ((this->_options).numLinesToReshape <= uVar20) {
            std::__cxx11::string::_M_assign((string *)&local_568,(string *)&local_2f8);
            std::__cxx11::string::_M_replace((string *)&local_2f8,0,local_2f0,"",0);
            local_570 = local_570 + 1;
            if ((this->_options).headerRow == local_570) {
              StringSplitter::initialize
                        (&local_4f8,&local_568,local_300,(this->_options).removeDuplicates,local_4e0
                        );
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_598,&local_4f8._tokens);
              local_4a8._M_allocated_capacity =
                   (size_type)
                   local_518.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pbStack_4b0 = local_518.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
              local_4b8 = (undefined1  [8])
                          local_518.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              local_518.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_598._0_8_;
              local_518.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_598._8_8_;
              local_518.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_598._16_8_;
              local_598._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_598._8_8_ = (pointer)0x0;
              local_598._16_8_ = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_4b8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_598);
              piVar15 = extraout_RDX_08;
            }
            else {
              uVar20 = (this->_options).numLinesToSkip;
              piVar15 = extraout_RDX_07;
              if (uVar20 < local_570) {
                if (uVar20 + (this->_options).numLinesToKeep < local_570) {
                  uVar20 = 0;
                  bVar7 = true;
                  if (2 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8._M_local_buf,"Skipping remaining lines.",0x19);
                    cVar6 = std::ios::widen((ios *)((long)&local_4a8 +
                                                   *(size_type *)
                                                    (local_4a8._M_allocated_capacity - 0x18)),'\n');
                    poVar9 = (ostream *)std::ostream::put((ostream *)local_4a8._M_local_buf,cVar6);
                    dVar5 = (double)std::ostream::flush(poVar9);
                    Logger::log(dVar5);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (extraout_RAX_03,(char *)local_598._0_8_,local_598._8_8_);
                    goto LAB_00188abb;
                  }
                  goto LAB_0018904e;
                }
                bVar7 = RowSampler::sample(&local_26c);
                if (bVar7) {
                  local_4a8._M_allocated_capacity = 0;
                  local_4a8._8_8_ = 0;
                  local_4b8 = (undefined1  [8])0x0;
                  pbStack_4b0 = (pointer)0x0;
                  local_498 = (_Bit_pointer)0x0;
                  StringSplitter::initialize
                            (&local_4f8,&local_568,local_300,(this->_options).removeDuplicates,
                             (vector<bool,_std::allocator<bool>_> *)local_4b8);
                  piVar15 = extraout_RDX_12;
                  if (local_4b8 != (undefined1  [8])0x0) {
                    operator_delete((void *)local_4b8,(long)local_498 - (long)local_4b8);
                    local_4b8 = (undefined1  [8])0x0;
                    pbStack_4b0 = (pointer)((ulong)pbStack_4b0 & 0xffffffff00000000);
                    local_4a8._M_allocated_capacity = 0;
                    local_4a8._8_8_ = local_4a8._8_8_ & 0xffffffff00000000;
                    local_498 = (_Bit_pointer)0x0;
                    piVar15 = extraout_RDX_13;
                  }
                  uVar23 = (long)local_4f8._tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_4f8._tokens.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start;
                  if (4 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8._M_local_buf,"Line = ",7);
                    poVar9 = std::ostream::_M_insert<unsigned_long>
                                       ((ostream *)local_4a8._M_local_buf,(ulong)local_570);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9," - content =\"",0xd);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       (poVar9,local_568._M_dataplus._M_p,local_568._M_string_length
                                       );
                    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
                    cVar6 = std::ios::widen((ios *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18)),
                                            '\n');
                    poVar9 = (ostream *)std::ostream::put(poVar9,cVar6);
                    dVar5 = (double)std::ostream::flush(poVar9);
                    Logger::log(dVar5);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (extraout_RAX_05,(char *)local_598._0_8_,local_598._8_8_);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_598._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_598 + 0x10)) {
                      operator_delete((void *)local_598._0_8_,
                                      (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p + 1));
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
                    std::ios_base::~ios_base((ios_base *)local_578);
                    piVar15 = extraout_RDX_14;
                  }
                  local_548 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)((long)uVar23 >> 5);
                  if (local_53c < 1) {
                    sVar22 = (size_type)(int)(uVar23 >> 5);
                    std::vector<DataPoint,_std::allocator<DataPoint>_>::resize(&local_538,sVar22);
                    std::vector<bool,_std::allocator<bool>_>::resize
                              (local_4e0,sVar22,
                               ((long)(this->_options).filterColumns.
                                      super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                      _M_p -
                               (long)(this->_options).filterColumns.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                               ) * 8 + (ulong)*(uint *)((long)&(this->_options).filterColumns.
                                                                                                                              
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base + 8) == 0);
                    puVar11 = (this->_options).filterColumns.
                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
                    puVar4 = (this->_options).filterColumns.
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
                    uVar20 = *(uint *)((long)&(this->_options).filterColumns.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base + 8);
                    iVar8 = 0;
                    if (uVar20 != 0 || puVar11 != puVar4) {
                      iVar8 = 0;
                      uVar23 = 0;
                      do {
                        iVar8 = iVar8 + (uint)((*puVar11 >> (uVar23 & 0x3f) & 1) != 0);
                        iVar18 = (int)uVar23;
                        puVar11 = puVar11 + (iVar18 == 0x3f);
                        uVar23 = (ulong)(iVar18 + 1);
                        if (iVar18 == 0x3f) {
                          uVar23 = 0;
                        }
                      } while ((uint)uVar23 != uVar20 || puVar11 != puVar4);
                    }
                    std::vector<DataPoint,_std::allocator<DataPoint>_>::resize
                              (&local_328,(long)iVar8);
                    piVar15 = extraout_RDX_15;
                    if (2 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4a8._M_local_buf,"Data dimensions set to ",0x17);
                      poVar9 = (ostream *)
                               std::ostream::operator<<
                                         ((ostream *)local_4a8._M_local_buf,(int)local_548);
                      cVar6 = std::ios::widen((ios *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18)),
                                              '\n');
                      poVar9 = (ostream *)std::ostream::put(poVar9,cVar6);
                      dVar5 = (double)std::ostream::flush(poVar9);
                      Logger::log(dVar5);
                      std::__cxx11::stringbuf::str();
                      std::__ostream_insert<char,std::char_traits<char>>
                                (extraout_RAX_06,(char *)local_598._0_8_,local_598._8_8_);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_598._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_598 + 0x10)) {
                        operator_delete((void *)local_598._0_8_,
                                        (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p + 1)
                                       );
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
                      std::ios_base::~ios_base((ios_base *)local_578);
                      piVar15 = extraout_RDX_16;
                    }
                    local_56c = iVar8;
                    if (2 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4a8._M_local_buf,"Mask dimensions set to ",0x17);
                      poVar9 = (ostream *)
                               std::ostream::operator<<((ostream *)local_4a8._M_local_buf,iVar8);
                      cVar6 = std::ios::widen((ios *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18)),
                                              '\n');
                      poVar9 = (ostream *)std::ostream::put(poVar9,cVar6);
                      dVar5 = (double)std::ostream::flush(poVar9);
                      Logger::log(dVar5);
                      std::__cxx11::stringbuf::str();
                      std::__ostream_insert<char,std::char_traits<char>>
                                (extraout_RAX_07,(char *)local_598._0_8_,local_598._8_8_);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_598._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_598 + 0x10)) {
                        operator_delete((void *)local_598._0_8_,
                                        (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p + 1)
                                       );
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
                      std::ios_base::~ios_base((ios_base *)local_578);
                      piVar15 = extraout_RDX_17;
                    }
                    local_53c = (int)local_548;
                  }
                  if (local_53c != (int)local_548) {
                    if (1 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                      uVar20 = local_570;
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4a8._M_local_buf,"Line = ",7);
                      poVar9 = std::ostream::_M_insert<unsigned_long>
                                         ((ostream *)local_4a8._M_local_buf,(ulong)uVar20);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9," - Statistics dimensions does not equal data dimensions.",
                                 0x38);
                      bVar7 = (this->_options).strictParsing != false;
                      pcVar19 = "";
                      if (bVar7) {
                        pcVar19 = " Skipping.";
                      }
                      lVar16 = 0;
                      if (bVar7) {
                        lVar16 = 10;
                      }
                      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar19,lVar16);
                      cVar6 = std::ios::widen((ios *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18)),
                                              '\n');
                      poVar9 = (ostream *)std::ostream::put(poVar9,cVar6);
                      dVar5 = (double)std::ostream::flush(poVar9);
                      Logger::log(dVar5);
                      std::__cxx11::stringbuf::str();
                      std::__ostream_insert<char,std::char_traits<char>>
                                (extraout_RAX_08,(char *)local_598._0_8_,local_598._8_8_);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_598._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_598 + 0x10)) {
                        operator_delete((void *)local_598._0_8_,
                                        (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p + 1)
                                       );
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
                      std::ios_base::~ios_base((ios_base *)local_578);
                      piVar15 = extraout_RDX_18;
                    }
                    if ((this->_options).strictParsing != false) goto LAB_0018904b;
                  }
                  uVar20 = local_570;
                  if (3 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8._M_local_buf,"Line = ",7);
                    poVar9 = std::ostream::_M_insert<unsigned_long>
                                       ((ostream *)local_4a8._M_local_buf,(ulong)uVar20);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar9," - Number of tokens found: ",0x1b);
                    poVar9 = std::ostream::_M_insert<unsigned_long>(poVar9,(ulong)local_548);
                    cVar6 = std::ios::widen((ios *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18)),
                                            '\n');
                    poVar9 = (ostream *)std::ostream::put(poVar9,cVar6);
                    dVar5 = (double)std::ostream::flush(poVar9);
                    Logger::log(dVar5);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (extraout_RAX_09,(char *)local_598._0_8_,local_598._8_8_);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_598._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_598 + 0x10)) {
                      operator_delete((void *)local_598._0_8_,
                                      (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p + 1));
                    }
                    std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
                    std::ios_base::~ios_base((ios_base *)local_578);
                  }
                  bVar7 = DataFilters::isFiltered(local_308,&local_4f8._tokens);
                  if (bVar7) {
                    local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)(long)local_53c;
                    if (local_2b8 < local_548) {
                      local_548 = local_2b8;
                    }
                    if (local_548 !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      local_2b0 = (ulong)local_570;
                      lVar16 = 8;
                      uVar23 = 0;
                      do {
                        if (((ulong)((long)local_538.
                                           super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_538.
                                           super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar23
                            ) || (bVar7 = StringSplitter::toValue<double>
                                                    (&local_4f8,uVar23,
                                                     (double *)
                                                     (&(local_538.
                                                                                                                
                                                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->active
                                                  + lVar16)),
                                 (ulong)((long)local_538.
                                               super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_538.
                                               super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 4) <=
                                 uVar23)) {
                          std::__throw_out_of_range_fmt
                                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                     ,uVar23);
                        }
                        *(bool *)((long)local_538.
                                        super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                                        _M_impl.super__Vector_impl_data._M_start + lVar16 + -8) =
                             bVar7;
                        if (4 < (int)Logger::logLevel) {
                          std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_4a8._M_local_buf,"Line = ",7);
                          poVar9 = std::ostream::_M_insert<unsigned_long>
                                             ((ostream *)local_4a8._M_local_buf,local_2b0);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar9," - ",3);
                          if ((ulong)((long)local_538.
                                            super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_538.
                                            super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4) <=
                              uVar23) {
LAB_0018a194:
                            std::__throw_out_of_range_fmt
                                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                       ,uVar23);
                          }
                          bVar2 = *(byte *)((long)local_538.
                                                  super__Vector_base<DataPoint,_std::allocator<DataPoint>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                           lVar16 + -8);
                          pcVar19 = "Invalid token";
                          if (bVar2 != 0) {
                            pcVar19 = "Valid token";
                          }
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar9,pcVar19,(ulong)(bVar2 ^ 1) * 2 + 0xb);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
                          if ((ulong)((long)local_4f8._tokens.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_4f8._tokens.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5) <=
                              uVar23) goto LAB_0018a194;
                          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                             (poVar9,*(char **)((long)local_4f8._tokens.
                                                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar16 * 2 + -0x10),
                                              *(long *)((long)local_4f8._tokens.
                                                                                                                            
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  lVar16 * 2 + -8));
                          cVar6 = std::ios::widen((ios *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18
                                                                            )),'\n');
                          poVar9 = (ostream *)std::ostream::put(poVar9,cVar6);
                          dVar5 = (double)std::ostream::flush(poVar9);
                          Logger::log(dVar5);
                          std::__cxx11::stringbuf::str();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    (extraout_RAX_10,(char *)local_598._0_8_,local_598._8_8_);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_598._0_8_ !=
                              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(local_598 + 0x10)) {
                            operator_delete((void *)local_598._0_8_,
                                            (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p
                                                   + 1));
                          }
                          std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
                          std::ios_base::~ios_base((ios_base *)local_578);
                        }
                        uVar23 = uVar23 + 1;
                        lVar16 = lVar16 + 0x10;
                      } while (local_548 !=
                               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)uVar23);
                    }
                    bVar7 = DataFilters::isFiltered(local_308,(DataVector *)&local_538);
                    if (bVar7) {
                      local_4b8 = (undefined1  [8])local_2b8;
                      local_598._0_8_ = SEXT48(local_56c);
                      local_298 = local_2b8;
                      DataVector::copy((EVP_PKEY_CTX *)&local_538,(EVP_PKEY_CTX *)local_4b8);
                      if ((this->_options).showFilteredData == true) {
                        stream = this->_outputStream;
                        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
                        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8," ","")
                        ;
                        StatisticsWriter::writeData
                                  (&local_4d8,stream,(DataVector *)&local_328,&local_2d8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
                          operator_delete(local_2d8._M_dataplus._M_p,
                                          local_2d8.field_2._M_allocated_capacity + 1);
                        }
                      }
                      MultivariateTracker::update(local_2a0,(DataVector *)&local_328);
                      for (pDVar12 = local_538.
                                     super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                                     _M_impl.super__Vector_impl_data._M_start;
                          piVar15 = extraout_RDX_21,
                          pDVar12 !=
                          local_538.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                          _M_impl.super__Vector_impl_data._M_finish; pDVar12 = pDVar12 + 1) {
                        pDVar12->active = false;
                      }
                    }
                    else {
                      piVar15 = extraout_RDX_20;
                      if (3 < (int)Logger::logLevel) {
                        std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_4a8._M_local_buf,"Line = ",7);
                        poVar9 = std::ostream::_M_insert<unsigned_long>
                                           ((ostream *)local_4a8._M_local_buf,(ulong)local_570);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar9," - filtered out by numeric filter",0x21);
                        std::endl<char,std::char_traits<char>>(poVar9);
                        Logger::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
                        std::__cxx11::stringbuf::str();
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (extraout_RAX_13,(char *)local_598._0_8_,local_598._8_8_);
                        goto LAB_00189010;
                      }
                    }
                  }
                  else {
                    piVar15 = extraout_RDX_19;
                    if (3 < (int)Logger::logLevel) {
                      std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_4a8._M_local_buf,"Line = ",7);
                      poVar9 = std::ostream::_M_insert<unsigned_long>
                                         ((ostream *)local_4a8._M_local_buf,(ulong)local_570);
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar9," - filtered out by string filter",0x20);
                      cVar6 = std::ios::widen((ios *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18)),
                                              '\n');
                      poVar9 = (ostream *)std::ostream::put(poVar9,cVar6);
                      dVar5 = (double)std::ostream::flush(poVar9);
                      Logger::log(dVar5);
                      std::__cxx11::stringbuf::str();
                      std::__ostream_insert<char,std::char_traits<char>>
                                (extraout_RAX_12,(char *)local_598._0_8_,local_598._8_8_);
LAB_00189010:
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_598._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_598 + 0x10)) {
                        operator_delete((void *)local_598._0_8_,
                                        (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p + 1)
                                       );
                      }
                      std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
                      std::ios_base::~ios_base((ios_base *)local_578);
                      piVar15 = extraout_RDX_09;
                    }
                  }
                }
                else {
                  piVar15 = extraout_RDX_11;
                  if (4 < (int)Logger::logLevel) {
                    std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_4a8._M_local_buf,"Row not sampled. Skipping",0x19);
                    cVar6 = std::ios::widen((ios *)(local_4a8._M_local_buf +
                                                   *(size_type *)
                                                    (local_4a8._M_allocated_capacity - 0x18)),'\n');
                    poVar9 = (ostream *)std::ostream::put((ostream *)local_4a8._M_local_buf,cVar6);
                    dVar5 = (double)std::ostream::flush(poVar9);
                    Logger::log(dVar5);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              (extraout_RAX_11,(char *)local_598._0_8_,local_598._8_8_);
                    goto LAB_00189010;
                  }
                }
              }
              else if (2 < (int)Logger::logLevel) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_4a8._M_local_buf,"Skipping header line.",0x15);
                cVar6 = std::ios::widen((ios *)(local_4a8._M_local_buf +
                                               *(size_type *)
                                                (local_4a8._M_allocated_capacity - 0x18)),'\n');
                poVar9 = (ostream *)std::ostream::put((ostream *)local_4a8._M_local_buf,cVar6);
                dVar5 = (double)std::ostream::flush(poVar9);
                Logger::log(dVar5);
                std::__cxx11::stringbuf::str();
                std::__ostream_insert<char,std::char_traits<char>>
                          (extraout_RAX_04,(char *)local_598._0_8_,local_598._8_8_);
                goto LAB_00189010;
              }
            }
LAB_0018904b:
            bVar7 = false;
            uVar20 = 0;
            goto LAB_0018904e;
          }
        }
      }
      bVar7 = false;
    }
    else {
      bVar7 = true;
      if (4 < (int)Logger::logLevel) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4a8._M_local_buf,"End of file found. Exiting.",0x1b);
        cVar6 = std::ios::widen((ios *)((long)&local_4a8 +
                                       *(size_type *)(local_4a8._M_allocated_capacity - 0x18)),'\n')
        ;
        poVar9 = (ostream *)std::ostream::put((ostream *)local_4a8._M_local_buf,cVar6);
        dVar5 = (double)std::ostream::flush(poVar9);
        Logger::log(dVar5);
        std::__cxx11::stringbuf::str();
        std::__ostream_insert<char,std::char_traits<char>>
                  (extraout_RAX_00,(char *)local_598._0_8_,local_598._8_8_);
LAB_00188abb:
        bVar7 = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_598 + 0x10)) {
          operator_delete((void *)local_598._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_598._16_8_)->_M_p + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
        std::ios_base::~ios_base((ios_base *)local_578);
        piVar15 = extraout_RDX_01;
      }
    }
LAB_0018904e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,
                      CONCAT44(local_568.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_568.field_2._M_local_buf[3],
                                        CONCAT12(local_568.field_2._M_local_buf[2],
                                                 CONCAT11(local_568.field_2._M_local_buf[1],
                                                          local_568.field_2._M_local_buf[0])))) + 1)
      ;
      piVar15 = extraout_RDX_10;
    }
  } while (!bVar7);
  sVar22 = (size_type)local_56c;
  local_578 = this;
  if ((long)local_518.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_518.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5 != sVar22) {
    if (((this->_options).headerRow != 0) && (0 < (int)Logger::logLevel)) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4a8._M_local_buf,
                 "Size of header titles does not match data dimensions so using indices as header titles."
                 ,0x57);
      cVar6 = std::ios::widen((ios *)((long)&local_4a8 +
                                     *(size_type *)(local_4a8._M_allocated_capacity - 0x18)),'\n');
      poVar9 = (ostream *)std::ostream::put((ostream *)local_4a8._M_local_buf,cVar6);
      dVar5 = (double)std::ostream::flush(poVar9);
      Logger::log(dVar5);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                (extraout_RAX_14,local_568._M_dataplus._M_p,local_568._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_568._M_dataplus._M_p != &local_568.field_2) {
        operator_delete(local_568._M_dataplus._M_p,
                        CONCAT44(local_568.field_2._M_allocated_capacity._4_4_,
                                 CONCAT13(local_568.field_2._M_local_buf[3],
                                          CONCAT12(local_568.field_2._M_local_buf[2],
                                                   CONCAT11(local_568.field_2._M_local_buf[1],
                                                            local_568.field_2._M_local_buf[0])))) +
                        1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
      std::ios_base::~ios_base(local_438);
    }
    local_4b8 = (undefined1  [8])&local_4a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4b8,"");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&local_518,sVar22,(value_type *)local_4b8);
    iVar8 = local_56c;
    if (local_4b8 != (undefined1  [8])&local_4a8) {
      operator_delete((void *)local_4b8,(ulong)(local_4a8._M_allocated_capacity + 1));
    }
    if (0 < iVar8) {
      lVar16 = 0;
      uVar23 = 0;
      do {
        uVar1 = uVar23 + 1;
        local_598._0_8_ = (undefined8)(long)uVar1;
        if (NAN((double)local_598._0_8_)) {
          local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
          local_568.field_2._M_local_buf[2] = 'n';
          local_568.field_2._M_local_buf[0] = 'n';
          local_568.field_2._M_local_buf[1] = 'a';
          local_568._M_string_length = 3;
          local_568.field_2._M_local_buf[3] = '\0';
        }
        else {
          local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
          local_568._M_string_length = 0;
          local_568.field_2._M_local_buf[0] = '\0';
          std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
          *(uint *)((long)auStack_490 + *(size_type *)(local_4a8._M_allocated_capacity - 0x18)) =
               *(uint *)((long)auStack_490 + *(size_type *)(local_4a8._M_allocated_capacity - 0x18))
               & 0xfffffefb | 4;
          std::ostream::_M_insert<long>((ostream *)local_4a8._M_local_buf,uVar1);
          std::operator>>((istream *)local_4b8,(string *)&local_568);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
          std::ios_base::~ios_base(local_438);
        }
        if ((ulong)((long)local_518.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_518.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar23) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar23);
        }
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)local_518.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar16),(string *)&local_568);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_568._M_dataplus._M_p != &local_568.field_2) {
          operator_delete(local_568._M_dataplus._M_p,
                          CONCAT44(local_568.field_2._M_allocated_capacity._4_4_,
                                   CONCAT13(local_568.field_2._M_local_buf[3],
                                            CONCAT12(local_568.field_2._M_local_buf[2],
                                                     CONCAT11(local_568.field_2._M_local_buf[1],
                                                              local_568.field_2._M_local_buf[0]))))
                          + 1);
        }
        lVar16 = lVar16 + 0x20;
        uVar23 = uVar1;
      } while (sVar22 != uVar1);
    }
  }
  if (0 < local_56c) {
    lVar16 = 8;
    lVar17 = 0xa8;
    uVar23 = 0;
    do {
      lVar13 = (long)(local_578->_tracker)._statistics.
                     super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_578->_tracker)._statistics.
                     super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      if (SBORROW8(uVar23,lVar13 * 0x34f72c234f72c235) ==
          (long)(uVar23 + lVar13 * -0x34f72c234f72c235) < 0) break;
      if ((ulong)((long)local_518.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_518.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar23) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   uVar23);
      }
      lVar13 = *(long *)((long)local_518.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8);
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_258,lVar13,
                 *(long *)((long)local_518.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar16) + lVar13);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_578->_tracker)._statistics.
                          super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
                          _M_impl.super__Vector_impl_data._M_start)->_count + lVar17),
                 (string *)local_258);
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      uVar23 = uVar23 + 1;
      lVar16 = lVar16 + 0x20;
      lVar17 = lVar17 + 0xe8;
    } while (sVar22 != uVar23);
  }
  if (2 < (int)Logger::logLevel) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_4b8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_4a8._M_local_buf,
                        ApplicationProperties::NAME_abi_cxx11_._M_dataplus._M_p,
                        ApplicationProperties::NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," is complete",0xc);
    cVar6 = std::ios::widen((ios *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18)),'\n');
    poVar9 = (ostream *)std::ostream::put(poVar9,cVar6);
    dVar5 = (double)std::ostream::flush(poVar9);
    Logger::log(dVar5);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              (extraout_RAX_15,local_568._M_dataplus._M_p,local_568._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_568._M_dataplus._M_p != &local_568.field_2) {
      operator_delete(local_568._M_dataplus._M_p,
                      CONCAT44(local_568.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_568.field_2._M_local_buf[3],
                                        CONCAT12(local_568.field_2._M_local_buf[2],
                                                 CONCAT11(local_568.field_2._M_local_buf[1],
                                                          local_568.field_2._M_local_buf[0])))) + 1)
      ;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_4b8);
    std::ios_base::~ios_base(local_438);
  }
  if (local_328.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_328.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_328.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_328.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_538.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_538.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_538.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_538.super__Vector_base<DataPoint,_std::allocator<DataPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8,local_2e8[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4f8._tokens);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._comment._M_dataplus._M_p != &local_4d8._comment.field_2) {
    operator_delete(local_4d8._comment._M_dataplus._M_p,
                    local_4d8._comment.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream((ifstream *)&stack0xfffffffffffffdc8);
  return 0;
}

Assistant:

int
    run(void)
    {

        // ==================================================
        // Application parameters
        // --------------------------------------------------
        int numDim = 0;
        int numDimMask = 0;

        // ==================================================
        // Define input stream
        // --------------------------------------------------
        std::ifstream fileInput(this->_options.fileInput.c_str(), std::ios::in);
        std::istream * source = (fileInput.good() ? &fileInput : &std::cin);

        LOG_MESSAGE(Logger::Level::INFO, ApplicationProperties::NAME << " is starting");

        // ==================================================
        // Define output writer
        // --------------------------------------------------
        StatisticsWriter writer;

        // ==================================================
        // Define row sampler
        // --------------------------------------------------
        RowSampler sampler(this->_options.sampling);

        // ==================================================
        // Loop through source data
        // --------------------------------------------------
        
        // titles is populated by parsed line if user provides a titles row, otherwise indices are used
        std::vector<std::string> titles;
        StringSplitter parser;
        
        // Counters used to keep track of line reads if reshaping is requested by user
        unsigned int counter = 0;
        unsigned int counterSinceLastParsing = 0;
        std::string lineToReshape = "";
        
        // DataVector contains the parsed data from each line.
        // It's size will get set on the first successful parsing.
        DataVector data;
        DataVector dataMasked;
        
        bool reading = true;
        while (reading)
        {

            // ==================================================
            // Extract current line
            // --------------------------------------------------
            std::string line = StatisticsApp::readline(*source);
            if (!(*source).good())
            {
                LOG_MESSAGE(Logger::Level::DETAIL, "End of file found. Exiting.");
                break;
            }

            // ==================================================
            // Check if line is empty and if we need to exit
            // --------------------------------------------------
            if (line.size() == 0)
            {
                if (this->_options.blankEOF)
                {
                    LOG_MESSAGE(Logger::Level::DETAIL, "Blank line found. Exiting.");
                    break;
                }
                else
                {
                    LOG_MESSAGE(Logger::Level::DETAIL, "Blank line found. Skipping.");
                    continue;
                }
            }
            
            // ==================================================
            // Check if row is comment and needs to be skipped
            // --------------------------------------------------
            if (line.compare(0,1,this->_options.comment.c_str()) == 0) continue;
            
            // ==================================================
            // Check if row needs to be reshaped into column
            // --------------------------------------------------

            // If yes, then append current line to previous
            // lines with delimiter and continue to next read
            counterSinceLastParsing++;
            lineToReshape += (counterSinceLastParsing == 1 ? "" : this->_options.delimiter) + line;
            if (counterSinceLastParsing < this->_options.numLinesToReshape) continue;

            // Prepare line and counter for parsing
            line = lineToReshape;
            counter++;

            // Reset counter and appended line for next read
            counterSinceLastParsing = 0;
            lineToReshape = "";

            // ==================================================
            // Extract header titles
            // --------------------------------------------------
            if (this->_options.headerRow == counter)
            {
                parser.initialize(line, this->_options.delimiter, this->_options.removeDuplicates, this->_options.filterColumns);
                titles = parser.tokens();
                continue;
            }
            
            // ==================================================
            // Skip header rows
            // --------------------------------------------------
            if (counter <= this->_options.numLinesToSkip)
            {
                LOG_MESSAGE(Logger::Level::INFO, "Skipping header line.");
                continue;
            }

            // ==================================================
            // Skip unneeded rows
            // --------------------------------------------------
            if (counter > (this->_options.numLinesToSkip + this->_options.numLinesToKeep))
            {
                LOG_MESSAGE(Logger::Level::INFO, "Skipping remaining lines.");
                break;
            }

            // ==================================================
            // Skip unsampled rows
            // --------------------------------------------------
            if (!sampler.sample())
            {
                LOG_MESSAGE(Logger::Level::DETAIL, "Row not sampled. Skipping");
                continue;
            }

            // ==================================================
            // Parse current line
            // --------------------------------------------------
            parser.initialize(line, this->_options.delimiter, this->_options.removeDuplicates);
            StringSplitter::size_type numTokens = parser.size();
            LOG_MESSAGE(Logger::Level::DETAIL, "Line = " << counter << " - content =\"" << line << "\"");

            // ==================================================
            // Check and compute source data dimensions
            // --------------------------------------------------
            bool isDimSet = numDim > 0;
            if (!isDimSet)
            {
                numDim = (int) numTokens;
                data.resize(numDim);

                // Make sure we only keep column filters if they are within actual number of columns
                this->_options.filterColumns.resize(numDim, (this->_options.filterColumns.size() == 0));

                // Compute how many columns are masked out
                numDimMask = std::accumulate(this->_options.filterColumns.begin(), this->_options.filterColumns.end(), 0);
                dataMasked.resize(numDimMask);

                LOG_MESSAGE(Logger::Level::INFO, "Data dimensions set to " << numDim);
                LOG_MESSAGE(Logger::Level::INFO, "Mask dimensions set to " << numDimMask);
            }

            bool isDimFailed = (numDim != (int) numTokens);
            if (isDimFailed)
            {
                LOG_MESSAGE(Logger::Level::WARNING, "Line = " << counter << " - Statistics dimensions does not equal data dimensions." << (this->_options.strictParsing ? " Skipping." : ""));
                if (this->_options.strictParsing)
                {
                    continue;
                }
            }

            LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - Number of tokens found: " << numTokens);

            // ==================================================
            // Apply string filters
            // --------------------------------------------------
            bool isStringFiltered = this->_options.filterRows.isFiltered(parser.get());
            if (!isStringFiltered)
            {
                LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - filtered out by string filter");
                continue;
            }

            // ==================================================
            // Convert tokens into data array
            // --------------------------------------------------
            for (StringSplitter::size_type i = 0; i < (StringSplitter::size_type) numDim; ++i)
            {

                if (numTokens <= i) break;

                data.at(i).active = parser.toValue<double>(i, data.at(i).value);

                LOG_MESSAGE(Logger::Level::DETAIL, "Line = " << counter << " - " << (data.at(i).active ? "Valid token" : "Invalid token") << " = " << parser.at(i));

            }

            // ==================================================
            // Apply numeric filters
            // --------------------------------------------------
            bool isNumericFiltered = this->_options.filterRows.isFiltered(data);
            if (!isNumericFiltered)
            {
                LOG_MESSAGE(Logger::Level::DEBUG, "Line = " << counter << " - filtered out by numeric filter");
                continue;
            }

            // ==================================================
            // Apply column filters
            // --------------------------------------------------
            DataVector::copy(data, numDim, dataMasked, numDimMask, this->_options.filterColumns, numDim);

            // ==================================================
            // Write current data
            // --------------------------------------------------
            if (this->_options.showFilteredData)
            {
                writer.writeData(*this->_outputStream, dataMasked);
            }

            // ==================================================
            // Update statistics with current data
            // --------------------------------------------------
            this->_tracker.update(dataMasked);

            // Since the data vector is preallocated, we deactivate all entries in case they don't exist in the next parsed line
            // This way they don't get inadvertently included in the next line's statistics
            data.deactivate();

        }

        // ==================================================
        // Update statistics names
        // --------------------------------------------------
        if (numDimMask != (long)titles.size())
        {
            // Show error message if user provided a bad header row
            if (this->_options.headerRow > 0)
            {
                LOG_MESSAGE(Logger::Level::ERROR, "Size of header titles does not match data dimensions so using indices as header titles.");
            }
            titles.resize(numDimMask,"");
            for (long i = 0; i < numDimMask; i++)
            {
                titles.at(i) = StringParser::parseNumber<long>(i+1);
            }
        }
        for (long i = 0; i < numDimMask && i < this->_tracker.getDimension(); i++)
        {
            this->_tracker.setName(i, titles.at(i));
        }

        LOG_MESSAGE(Logger::Level::INFO, ApplicationProperties::NAME << " is complete");
    
        return 0;
        
    }